

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O2

void libxml_domnode_tim_sort(xmlNodePtr *dst,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  uint stack_curr_00;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  uint stack_curr_01;
  size_t stack_curr;
  TEMP_STORAGE_T _store;
  ulong uStack_858;
  size_t local_850;
  size_t curr;
  size_t local_840;
  TIM_SORT_RUN_T run_stack [128];
  
  stack_curr = 0;
  curr = 0;
  if (1 < size) {
    if (size < 0x40) {
      libxml_domnode_binary_insertion_sort(dst,size);
      return;
    }
    lVar5 = 0x3f;
    if (size != 0) {
      for (; size >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    bVar7 = 0x3a - ((byte)lVar5 ^ 0x3f);
    sVar10 = (size_t)(int)(((int)(size >> (bVar7 & 0x3f)) + 1) -
                          (uint)((~(-1L << (bVar7 & 0x3f)) & size) == 0));
    _store.alloc = 0;
    _store.storage = (xmlNodePtr *)0x0;
    iVar6 = PUSH_NEXT(dst,size,&_store,sVar10,run_stack,&stack_curr,&curr);
    if (((iVar6 != 0) &&
        (iVar6 = PUSH_NEXT(dst,size,&_store,sVar10,run_stack,&stack_curr,&curr), iVar6 != 0)) &&
       (iVar6 = PUSH_NEXT(dst,size,&_store,sVar10,run_stack,&stack_curr,&curr), iVar6 != 0)) {
      local_850 = size;
      local_840 = sVar10;
LAB_001b1331:
      do {
        stack_curr_00 = (uint)stack_curr;
        if (1 < (int)stack_curr_00) {
          if (stack_curr_00 == 2) {
            if (run_stack[0].length <= run_stack[1].length) {
LAB_001b139d:
              while (size = local_850, stack_curr_01 = stack_curr_00 - 1, stack_curr_01 != 1) {
                uVar9 = (ulong)stack_curr_00;
                uVar8 = (&uStack_858)[uVar9 * 2 + -1];
                uVar2 = (&local_850)[uVar9 * 2];
                if (stack_curr_00 < 4) {
                  bVar4 = false;
                }
                else {
                  bVar4 = (&stack_curr)[uVar9 * 2] <= uVar2 + uVar8;
                }
                uVar3 = run_stack[stack_curr_01].length;
                uVar1 = uVar3 + uVar2;
                if ((uVar1 < uVar8 && !bVar4) && (uVar3 < uVar2)) goto LAB_001b14a9;
                if ((uVar1 < uVar8 && !bVar4) || (uVar2 <= uVar3)) {
                  libxml_domnode_tim_sort_merge(dst,run_stack,stack_curr_00,&_store);
                  (&local_850)[uVar9 * 2] = uVar1;
                  stack_curr_00 = stack_curr_01;
                }
                else {
                  libxml_domnode_tim_sort_merge(dst,run_stack,stack_curr_01,&_store);
                  (&uStack_858)[uVar9 * 2 + -1] = uVar2 + uVar8;
                  sVar10 = run_stack[stack_curr_01].length;
                  (&uStack_858)[uVar9 * 2] = run_stack[stack_curr_01].start;
                  (&local_850)[uVar9 * 2] = sVar10;
                  stack_curr_00 = stack_curr_01;
                }
              }
              sVar10 = run_stack[1].length + run_stack[0].length;
              uVar9 = 2;
              if (run_stack[0].length <= run_stack[1].length || sVar10 == local_850) {
                libxml_domnode_tim_sort_merge(dst,run_stack,2,&_store);
                run_stack[0].length = sVar10;
                uVar9 = 1;
              }
LAB_001b14a9:
              stack_curr = uVar9;
              sVar10 = local_840;
              goto LAB_001b1331;
            }
          }
          else {
            uVar8 = (ulong)(stack_curr_00 & 0x7fffffff);
            if (((&local_850)[uVar8 * 2] <= run_stack[uVar8 - 1].length) ||
               ((&uStack_858)[uVar8 * 2 + -1] <=
                run_stack[uVar8 - 1].length + (&local_850)[uVar8 * 2])) goto LAB_001b139d;
          }
        }
        iVar6 = PUSH_NEXT(dst,size,&_store,sVar10,run_stack,&stack_curr,&curr);
      } while (iVar6 != 0);
    }
  }
  return;
}

Assistant:

void TIM_SORT(SORT_TYPE *dst, const size_t size) {
  size_t minrun;
  TEMP_STORAGE_T _store, *store;
  TIM_SORT_RUN_T run_stack[TIM_SORT_STACK_SIZE];
  size_t stack_curr = 0;
  size_t curr = 0;

  /* don't bother sorting an array of size 1 */
  if (size <= 1) {
    return;
  }

  if (size < 64) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  /* compute the minimum run length */
  minrun = compute_minrun(size);
  /* temporary storage for merges */
  store = &_store;
  store->alloc = 0;
  store->storage = NULL;

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
    return;
  }

  while (1) {
    if (!CHECK_INVARIANT(run_stack, stack_curr)) {
      stack_curr = TIM_SORT_COLLAPSE(dst, run_stack, stack_curr, store, size);
      continue;
    }

    if (!PUSH_NEXT(dst, size, store, minrun, run_stack, &stack_curr, &curr)) {
      return;
    }
  }
}